

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void EdgeDetectionHelper::find
               (EdgeDetectionBase<float> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  EdgeParameter *in_stack_000001e8;
  uint32_t in_stack_000001f0;
  uint32_t in_stack_000001f4;
  uint32_t in_stack_000001f8;
  uint32_t in_stack_000001fc;
  Image *in_stack_00000200;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *in_stack_00000210;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *in_stack_00000218;
  
  anon_unknown.dwarf_71625::findEdgePoints<float>
            (in_stack_00000200,in_stack_000001fc,in_stack_000001f8,in_stack_000001f4,
             in_stack_000001f0,in_stack_000001e8,in_stack_00000210,in_stack_00000218);
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<float> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}